

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

int cram_external_decode_block
              (cram_slice *slice,cram_codec *c,cram_block *in,char *out_,int *out_size)

{
  uint uVar1;
  int iVar2;
  uchar *puVar3;
  int iVar4;
  void *pvVar5;
  cram_block *pcVar6;
  ulong uVar7;
  int iVar8;
  size_t __size;
  ulong uVar9;
  undefined1 auVar10 [16];
  double dVar11;
  
  iVar4 = -1;
  if (slice->block_by_id == (cram_block **)0x0) {
    uVar1 = slice->hdr->num_blocks;
    uVar7 = 0;
    uVar9 = 0;
    if (0 < (int)uVar1) {
      uVar9 = (ulong)uVar1;
    }
    pcVar6 = (cram_block *)0x0;
    for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      pcVar6 = slice->block[uVar7];
      if (((pcVar6 != (cram_block *)0x0) && (pcVar6->content_type == EXTERNAL)) &&
         (pcVar6->content_id == (c->field_6).huffman.ncodes)) {
        uVar9 = uVar7 & 0xffffffff;
        break;
      }
    }
    if ((uint)uVar9 == uVar1) {
      return -1;
    }
    if (pcVar6 == (cram_block *)0x0) {
      return -1;
    }
  }
  else {
    pcVar6 = slice->block_by_id[(c->field_6).huffman.ncodes];
    if (pcVar6 == (cram_block *)0x0) {
      return -(uint)(*out_size != 0);
    }
  }
  puVar3 = pcVar6->data;
  iVar2 = pcVar6->idx;
  iVar8 = *out_size + iVar2;
  pcVar6->idx = iVar8;
  if (puVar3 != (uchar *)0x0 && iVar8 <= pcVar6->uncomp_size) {
    while( true ) {
      uVar9 = *(ulong *)(out_ + 0x28);
      if ((ulong)(*(long *)(out_ + 0x30) + (long)*out_size) < uVar9) break;
      auVar10._8_4_ = (int)(uVar9 >> 0x20);
      auVar10._0_8_ = uVar9;
      auVar10._12_4_ = 0x45300000;
      dVar11 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0)) * 1.5;
      uVar7 = (ulong)dVar11;
      __size = (long)(dVar11 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
      if (uVar9 == 0) {
        __size = 0x400;
      }
      *(size_t *)(out_ + 0x28) = __size;
      pvVar5 = realloc(*(void **)(out_ + 0x20),__size);
      *(void **)(out_ + 0x20) = pvVar5;
    }
    memcpy((void *)(*(long *)(out_ + 0x30) + *(long *)(out_ + 0x20)),puVar3 + iVar2,(long)*out_size)
    ;
    *(long *)(out_ + 0x30) = *(long *)(out_ + 0x30) + (long)*out_size;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int cram_external_decode_block(cram_slice *slice, cram_codec *c,
				      cram_block *in, char *out_,
				      int *out_size) {
    int i;
    char *cp;
    cram_block *b = NULL;
    cram_block *out = (cram_block *)out_;

    /* Find the external block */
    if (slice->block_by_id) {
	if (!(b = slice->block_by_id[c->external.content_id]))
	    return *out_size?-1:0;
    } else {
	for (i = 0; i < slice->hdr->num_blocks; i++) {
	    b = slice->block[i];
	    if (b && b->content_type == EXTERNAL &&
		b->content_id == c->external.content_id) {
		break;
	    }
	}
	if (i == slice->hdr->num_blocks || !b)
	    return -1;
    }

    cp = cram_extract_block(b, *out_size);
    if (!cp)
	return -1;

    BLOCK_APPEND(out, cp, *out_size);
    return 0;
}